

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1942f::matrix_dot_notmatch_1_Test::TestBody(matrix_dot_notmatch_1_Test *this)

{
  initializer_list<double> __l;
  initializer_list<std::vector<double,_std::allocator<double>_>_> __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  initializer_list<std::vector<double,_std::allocator<double>_>_> __l_03;
  vector<double,_std::allocator<double>_> *local_248;
  vector<double,_std::allocator<double>_> *local_218;
  exception *e;
  matrix m3;
  allocator<std::vector<double,_std::allocator<double>_>_> local_1a3;
  undefined1 local_1a2;
  allocator<double> local_1a1;
  double local_1a0 [2];
  iterator local_190;
  size_type local_188;
  vector<double,_std::allocator<double>_> *local_180;
  vector<double,_std::allocator<double>_> local_178;
  undefined1 local_160 [40];
  undefined1 local_138 [8];
  matrix m2;
  allocator<std::vector<double,_std::allocator<double>_>_> local_fb;
  undefined1 local_fa;
  allocator<double> local_f9;
  double local_f8 [2];
  iterator local_e8;
  size_type local_e0;
  allocator<double> local_c1;
  double local_c0 [2];
  iterator local_b0;
  size_type local_a8;
  vector<double,_std::allocator<double>_> *local_a0;
  vector<double,_std::allocator<double>_> local_98;
  vector<double,_std::allocator<double>_> local_80;
  undefined1 local_68 [40];
  undefined1 local_40 [8];
  matrix m1;
  matrix_dot_notmatch_1_Test *this_local;
  
  local_fa = 1;
  local_c0[0] = 1.0;
  local_c0[1] = 2.0;
  local_b0 = local_c0;
  local_a8 = 2;
  local_a0 = &local_98;
  m1.super_tensor<double,_2U>._shape._M_elems = (_Type)this;
  std::allocator<double>::allocator(&local_c1);
  __l_02._M_len = local_a8;
  __l_02._M_array = local_b0;
  std::vector<double,_std::allocator<double>_>::vector(&local_98,__l_02,&local_c1);
  local_f8[0] = 3.0;
  local_f8[1] = 4.0;
  local_e8 = local_f8;
  local_e0 = 2;
  local_a0 = &local_80;
  std::allocator<double>::allocator(&local_f9);
  __l_01._M_len = local_e0;
  __l_01._M_array = local_e8;
  std::vector<double,_std::allocator<double>_>::vector(&local_80,__l_01,&local_f9);
  local_fa = 0;
  local_68._0_8_ = &local_98;
  local_68._8_8_ = (pointer)0x2;
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator(&local_fb);
  __l_03._M_len = local_68._8_8_;
  __l_03._M_array = (iterator)local_68._0_8_;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)(local_68 + 0x10),__l_03,&local_fb);
  m2.super_tensor<double,_2U>._shape._M_elems[1] = 2;
  dnet::data_types::matrix::matrix
            ((matrix *)local_40,(type *)(local_68 + 0x10),
             (axes_type *)(m2.super_tensor<double,_2U>._shape._M_elems + 1));
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)(local_68 + 0x10));
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator(&local_fb);
  local_218 = (vector<double,_std::allocator<double>_> *)local_68;
  do {
    local_218 = local_218 + -1;
    std::vector<double,_std::allocator<double>_>::~vector(local_218);
  } while (local_218 != &local_98);
  std::allocator<double>::~allocator(&local_f9);
  std::allocator<double>::~allocator(&local_c1);
  local_1a2 = 1;
  local_1a0[0] = 1.0;
  local_1a0[1] = 2.0;
  local_190 = local_1a0;
  local_188 = 2;
  local_180 = &local_178;
  std::allocator<double>::allocator(&local_1a1);
  __l._M_len = local_188;
  __l._M_array = local_190;
  std::vector<double,_std::allocator<double>_>::vector(&local_178,__l,&local_1a1);
  local_1a2 = 0;
  local_160._0_8_ = &local_178;
  local_160._8_8_ = (pointer)0x1;
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator(&local_1a3);
  __l_00._M_len = local_160._8_8_;
  __l_00._M_array = (iterator)local_160._0_8_;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)(local_160 + 0x10),__l_00,&local_1a3);
  m3.super_tensor<double,_2U>._shape._M_elems[1] = 1;
  dnet::data_types::matrix::matrix
            ((matrix *)local_138,(type *)(local_160 + 0x10),
             (axes_type *)(m3.super_tensor<double,_2U>._shape._M_elems + 1));
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)(local_160 + 0x10));
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator(&local_1a3);
  local_248 = (vector<double,_std::allocator<double>_> *)local_160;
  do {
    local_248 = local_248 + -1;
    std::vector<double,_std::allocator<double>_>::~vector(local_248);
  } while (local_248 != &local_178);
  std::allocator<double>::~allocator(&local_1a1);
  dnet::data_types::matrix::dot((matrix *)&e,(matrix *)local_40,(matrix *)local_138);
  dnet::data_types::matrix::~matrix((matrix *)&e);
  dnet::data_types::matrix::~matrix((matrix *)local_138);
  dnet::data_types::matrix::~matrix((matrix *)local_40);
  return;
}

Assistant:

TEST(matrix, dot_notmatch_1)
    {
        matrix m1({{1, 2}, {3, 4}}, {2, 2});
        matrix m2({{1, 2}}, {1, 2});
        try {
            matrix m3 = m1.dot(m2);
        }
        catch (const dnet::misc::exception &e) {
            std::cout << e;
        }
    }